

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

string * kratos::blue_line_abi_cxx11_(void)

{
  string *in_RDI;
  undefined4 local_28;
  uint32_t i;
  string *result;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  for (local_28 = 0; local_28 < 0x50; local_28 = local_28 + 1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string inline blue_line() {
    std::string result;
    result.append(BLUE);

    for (uint32_t i = 0; i < LINE_WIDTH; i++) result.append("-");

    result.append(ENDC);
    return result;
}